

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeventdispatcher_glib.cpp
# Opt level: O3

bool __thiscall
QEventDispatcherGlib::processEvents(QEventDispatcherGlib *this,ProcessEventsFlags flags)

{
  undefined4 uVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  bool bVar5;
  
  lVar2 = *(long *)(this + 8);
  uVar4 = (uint)flags.super_QFlagsStorageHelper<QEventLoop::ProcessEventsFlag,_4>.
                super_QFlagsStorage<QEventLoop::ProcessEventsFlag>.i & 4;
  if (uVar4 == 0) {
    QAbstractEventDispatcher::awake((QAbstractEventDispatcher *)this);
  }
  else {
    QAbstractEventDispatcher::aboutToBlock((QAbstractEventDispatcher *)this);
  }
  uVar1 = *(undefined4 *)(*(long *)(lVar2 + 0xb0) + 0x88);
  ((QFlagsStorageHelper<QEventLoop::ProcessEventsFlag,_4> *)(*(long *)(lVar2 + 0xb0) + 0x88))->
  super_QFlagsStorage<QEventLoop::ProcessEventsFlag> =
       (QFlagsStorage<QEventLoop::ProcessEventsFlag>)
       flags.super_QFlagsStorageHelper<QEventLoop::ProcessEventsFlag,_4>.
       super_QFlagsStorage<QEventLoop::ProcessEventsFlag>.i;
  if (((uint)flags.super_QFlagsStorageHelper<QEventLoop::ProcessEventsFlag,_4>.
             super_QFlagsStorage<QEventLoop::ProcessEventsFlag>.i & 0x20) == 0) {
    *(undefined1 *)(*(long *)(lVar2 + 0xb0) + 0x8c) = 0;
  }
  iVar3 = g_main_context_iteration(*(undefined8 *)(lVar2 + 0x98),uVar4 >> 2);
  bVar5 = iVar3 != 0;
  if ((uVar4 != 0) && (iVar3 == 0)) {
    do {
      iVar3 = g_main_context_iteration(*(undefined8 *)(lVar2 + 0x98),uVar4 >> 2);
    } while (iVar3 == 0);
    bVar5 = true;
  }
  *(undefined4 *)(*(long *)(lVar2 + 0xb0) + 0x88) = uVar1;
  if (uVar4 != 0) {
    QAbstractEventDispatcher::awake((QAbstractEventDispatcher *)this);
  }
  return bVar5;
}

Assistant:

bool QEventDispatcherGlib::processEvents(QEventLoop::ProcessEventsFlags flags)
{
    Q_D(QEventDispatcherGlib);

    const bool canWait = flags.testAnyFlag(QEventLoop::WaitForMoreEvents);
    if (canWait)
        emit aboutToBlock();
    else
        emit awake();

    // tell postEventSourcePrepare() and timerSource about any new flags
    QEventLoop::ProcessEventsFlags savedFlags = d->timerSource->processEventsFlags;
    d->timerSource->processEventsFlags = flags;

    if (!(flags & QEventLoop::EventLoopExec)) {
        // force timers to be sent at normal priority
        d->timerSource->runWithIdlePriority = false;
    }

    bool result = g_main_context_iteration(d->mainContext, canWait);
    while (!result && canWait)
        result = g_main_context_iteration(d->mainContext, canWait);

    d->timerSource->processEventsFlags = savedFlags;

    if (canWait)
        emit awake();

    return result;
}